

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out,bool metacolon)

{
  byte *pbVar1;
  byte bVar2;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_00;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_01;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_02;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_03;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_04;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  out_05;
  int iVar3;
  byte *pbVar4;
  const_reference pvVar5;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  tmp;
  undefined1 local_78 [16];
  _func_int **local_68;
  refcount_ptr<boost::exception_detail::error_info_container> local_60;
  char *pcStack_58;
  char *local_50;
  undefined8 local_48;
  error_type local_40;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *local_38;
  
  pbVar4 = (byte *)cur->_M_current;
  local_38 = __return_storage_ptr__;
  if (pbVar4 != (byte *)end._M_current) {
    do {
      bVar2 = *pbVar4;
      if (bVar2 < 0x3a) {
        if (bVar2 == 0x24) {
          cur->_M_current = (char *)(pbVar4 + 1);
          out_02.rest_ = out.rest_;
          out_02.next_ = out.next_;
          out_02.out_.container._4_4_ = out.out_.container._4_4_;
          out_02.out_.container._0_1_ = out.out_.container._0_1_;
          out_02.out_.container._1_3_ = out.out_.container._1_3_;
          out_02.traits_._4_4_ = out.traits_._4_4_;
          out_02.traits_._0_4_ = out.traits_._0_4_;
          format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                      *)local_78,this,cur,end,out_02);
LAB_00140309:
          out.next_ = (transform_op)local_68;
          out.rest_ = (transform_op)((ulong)local_68 >> 0x20);
          out.out_.container._0_4_ = SUB84(local_78._0_8_,0);
          out.out_.container._4_4_ = SUB84(local_78._0_8_,4);
          out.traits_._0_4_ = SUB84(local_78._8_8_,0);
          out.traits_._4_4_ = SUB84(local_78._8_8_,4);
        }
        else {
          if (bVar2 != 0x28) {
            if (bVar2 != 0x29) goto LAB_00140328;
LAB_00140360:
            cur->_M_current = (char *)(pbVar4 + 1);
            break;
          }
          cur->_M_current = (char *)(pbVar4 + 1);
          out_00.rest_ = out.rest_;
          out_00.next_ = out.next_;
          out_00.out_.container._4_4_ = out.out_.container._4_4_;
          out_00.out_.container._0_1_ = out.out_.container._0_1_;
          out_00.out_.container._1_3_ = out.out_.container._1_3_;
          out_00.traits_._4_4_ = out.traits_._4_4_;
          out_00.traits_._0_4_ = out.traits_._0_4_;
          format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                    ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                      *)local_78,this,cur,end,out_00,false);
          out.next_ = (transform_op)local_68;
          out.rest_ = (transform_op)((ulong)local_68 >> 0x20);
          out.out_.container._0_4_ = SUB84(local_78._0_8_,0);
          out.out_.container._4_4_ = SUB84(local_78._0_8_,4);
          out.traits_._0_4_ = SUB84(local_78._8_8_,0);
          out.traits_._4_4_ = SUB84(local_78._8_8_,4);
          if (cur->_M_current[-1] != ')') {
            std::runtime_error::runtime_error
                      ((runtime_error *)local_78,"unbalanced parentheses in format string");
            local_60.px_ = (error_info_container *)0x0;
            local_78._0_8_ = &PTR__regex_error_00195328;
            local_68 = (_func_int **)&PTR__regex_error_00195350;
            local_40 = error_paren;
            pcStack_58 = 
            "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
            ;
            local_50 = 
            "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
            ;
            local_48._0_4_ = 0x43b;
            local_48._4_4_ = -1;
            throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
          }
        }
      }
      else {
        if (bVar2 == 0x3a) {
          if (metacolon) goto LAB_00140360;
        }
        else {
          if (bVar2 == 0x5c) {
            pbVar1 = pbVar4 + 1;
            cur->_M_current = (char *)pbVar1;
            if ((pbVar1 == (byte *)end._M_current) || (*pbVar1 != 0x67)) {
              out_03.rest_ = out.rest_;
              out_03.next_ = out.next_;
              out_03.out_.container._4_4_ = out.out_.container._4_4_;
              out_03.out_.container._0_1_ = out.out_.container._0_1_;
              out_03.out_.container._1_3_ = out.out_.container._1_3_;
              out_03.traits_._4_4_ = out.traits_._4_4_;
              out_03.traits_._0_4_ = out.traits_._0_4_;
              format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                          *)local_78,this,cur,end,out_03);
            }
            else {
              cur->_M_current = (char *)(pbVar4 + 2);
              out_01.rest_ = out.rest_;
              out_01.next_ = out.next_;
              out_01.out_.container._4_4_ = out.out_.container._4_4_;
              out_01.out_.container._0_1_ = out.out_.container._0_1_;
              out_01.out_.container._1_3_ = out.out_.container._1_3_;
              out_01.traits_._4_4_ = out.traits_._4_4_;
              out_01.traits_._0_4_ = out.traits_._0_4_;
              format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                          *)local_78,this,cur,end,out_01);
            }
            goto LAB_00140309;
          }
          if (bVar2 == 0x3f) {
            cur->_M_current = (char *)(pbVar4 + 1);
            if (pbVar4 + 1 == (byte *)end._M_current) {
              std::runtime_error::runtime_error
                        ((runtime_error *)local_78,"malformed conditional in format string");
              local_60.px_ = (error_info_container *)0x0;
              local_78._0_8_ = &PTR__regex_error_00195328;
              local_68 = (_func_int **)&PTR__regex_error_00195350;
              local_40 = error_subreg;
              pcStack_58 = 
              "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
              ;
              local_50 = 
              "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
              ;
              local_48._0_4_ = 0x440;
              local_48._4_4_ = -1;
              throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
            }
            iVar3 = detail::
                    toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                              (cur,end,*(traits<char> **)(this + 0x80),10,*(int *)(this + 8) + -1);
            if (iVar3 == 0) {
              std::runtime_error::runtime_error((runtime_error *)local_78,"invalid back-reference");
              local_60.px_ = (error_info_container *)0x0;
              local_78._0_8_ = &PTR__regex_error_00195328;
              local_68 = (_func_int **)&PTR__regex_error_00195350;
              local_40 = error_subreg;
              pcStack_58 = 
              "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
              ;
              local_50 = 
              "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
              ;
              local_48._0_4_ = 0x443;
              local_48._4_4_ = -1;
              throw_exception<boost::xpressive::regex_error>((regex_error *)local_78);
            }
            pvVar5 = detail::
                     sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(this + 8),(long)iVar3);
            if (pvVar5->matched == true) {
              out_04.rest_ = out.rest_;
              out_04.next_ = out.next_;
              out_04.out_.container._4_4_ = out.out_.container._4_4_;
              out_04.out_.container._0_1_ = out.out_.container._0_1_;
              out_04.out_.container._1_3_ = out.out_.container._1_3_;
              out_04.traits_._4_4_ = out.traits_._4_4_;
              out_04.traits_._0_4_ = out.traits_._0_4_;
              format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                        ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                          *)local_78,this,cur,end,out_04,true);
              out.next_ = (transform_op)local_68;
              out.rest_ = (transform_op)((ulong)local_68 >> 0x20);
              out.out_.container._0_4_ = local_78._0_4_;
              out.out_.container._4_4_ = local_78._4_4_;
              out.traits_._0_4_ = local_78._8_4_;
              out.traits_._4_4_ = local_78._12_4_;
              if (cur->_M_current[-1] == ':') {
                format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                          (this,cur,end._M_current,0);
              }
            }
            else {
              format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                        (this,cur,end._M_current,1);
              if (cur->_M_current[-1] == ':') {
                out_05.rest_ = out.rest_;
                out_05.next_ = out.next_;
                out_05.out_.container._4_4_ = out.out_.container._4_4_;
                out_05.out_.container._0_1_ = out.out_.container._0_1_;
                out_05.out_.container._1_3_ = out.out_.container._1_3_;
                out_05.traits_._4_4_ = out.traits_._4_4_;
                out_05.traits_._0_4_ = out.traits_._0_4_;
                format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                          ((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                            *)local_78,this,cur,end,out_05,false);
                out.next_ = (transform_op)local_68;
                out.rest_ = (transform_op)((ulong)local_68 >> 0x20);
                out.out_.container._0_4_ = SUB84(local_78._0_8_,0);
                out.out_.container._4_4_ = SUB84(local_78._0_8_,4);
                out.traits_._0_4_ = SUB84(local_78._8_8_,0);
                out.traits_._4_4_ = SUB84(local_78._8_8_,4);
              }
            }
            break;
          }
        }
LAB_00140328:
        cur->_M_current = (char *)(pbVar4 + 1);
        local_68 = (_func_int **)CONCAT44(out.rest_,out.next_);
        local_78._0_8_ = CONCAT44(out.out_.container._4_4_,out.out_.container._0_4_);
        local_78._8_8_ = CONCAT44(out.traits_._4_4_,out.traits_._0_4_);
        out.next_ = op_none;
        detail::
        case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
        ::operator=((case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                     *)local_78,*pbVar4);
      }
      pbVar4 = (byte *)cur->_M_current;
    } while (pbVar4 != (byte *)end._M_current);
  }
  local_38->next_ = out.next_;
  local_38->rest_ = out.rest_;
  (local_38->out_).container =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(out.out_.container._4_4_,out.out_.container._0_4_);
  local_38->traits_ = (traits<char> *)CONCAT44(out.traits_._4_4_,out.traits_._0_4_);
  return local_38;
}

Assistant:

OutputIterator format_all_impl_(ForwardIterator &cur, ForwardIterator end, OutputIterator out, bool metacolon = false) const
    {
        int max = 0, sub = 0;
        detail::noop_output_iterator<char_type> noop;

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    out = this->format_named_backref_(++cur, end, out);
                }
                else
                {
                    out = this->format_escape_(cur, end, out);
                }
                break;

            case BOOST_XPR_CHAR_(char_type, '('):
                out = this->format_all_impl_(++cur, end, out);
                BOOST_XPR_ENSURE_(BOOST_XPR_CHAR_(char_type, ')') == *(cur-1)
                  , regex_constants::error_paren, "unbalanced parentheses in format string");
                break;

            case BOOST_XPR_CHAR_(char_type, '?'):
                BOOST_XPR_ENSURE_(++cur != end
                  , regex_constants::error_subreg, "malformed conditional in format string");
                max = static_cast<int>(this->size() - 1);
                sub = detail::toi(cur, end, *this->traits_, 10, max);
                BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
                if(this->sub_matches_[ sub ].matched)
                {
                    out = this->format_all_impl_(cur, end, out, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        this->format_all_impl_(cur, end, noop);
                }
                else
                {
                    this->format_all_impl_(cur, end, noop, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        out = this->format_all_impl_(cur, end, out);
                }
                return out;

            case BOOST_XPR_CHAR_(char_type, ':'):
                if(metacolon)
                {
                    BOOST_FALLTHROUGH;
            case BOOST_XPR_CHAR_(char_type, ')'):
                    ++cur;
                    return out;
                }
                BOOST_FALLTHROUGH;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }